

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::seekValueCase
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_t sVar9;
  size_type *psVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  CppGenerator *pCVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  string __str_1;
  string __str;
  string __str_4;
  string __str_3;
  string __str_2;
  string __str_5;
  ulong *local_a78;
  long local_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong *local_a58;
  uint local_a50;
  undefined4 uStack_a4c;
  ulong local_a48 [2];
  ulong *local_a38;
  uint local_a30;
  undefined4 uStack_a2c;
  ulong local_a28 [2];
  ulong *local_a18;
  uint local_a10;
  undefined4 uStack_a0c;
  ulong local_a08 [2];
  string *local_9f8;
  ulong *local_9f0;
  uint local_9e8;
  undefined4 uStack_9e4;
  ulong local_9e0 [2];
  ulong *local_9d0;
  uint local_9c8;
  undefined4 uStack_9c4;
  ulong local_9c0 [2];
  ulong *local_9b0;
  uint local_9a8;
  undefined4 uStack_9a4;
  ulong local_9a0 [2];
  ulong *local_990;
  long local_988;
  ulong local_980;
  long lStack_978;
  ulong *local_970;
  long local_968;
  ulong local_960;
  long lStack_958;
  ulong *local_950;
  long local_948;
  ulong local_940;
  long lStack_938;
  ulong *local_930;
  long local_928;
  ulong local_920;
  long lStack_918;
  ulong *local_910;
  long local_908;
  ulong local_900;
  long lStack_8f8;
  ulong *local_8f0;
  long local_8e8;
  ulong local_8e0;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  ulong *local_8d0;
  long local_8c8;
  ulong local_8c0;
  long lStack_8b8;
  ulong *local_8b0;
  long local_8a8;
  ulong local_8a0;
  long lStack_898;
  ulong *local_890;
  long local_888;
  ulong local_880;
  long lStack_878;
  ulong *local_870;
  long local_868;
  ulong local_860;
  long lStack_858;
  ulong *local_850;
  long local_848;
  ulong local_840;
  long lStack_838;
  ulong *local_830;
  long local_828;
  ulong local_820;
  long lStack_818;
  ulong *local_810;
  long local_808;
  ulong local_800;
  long lStack_7f8;
  ulong *local_7f0;
  long local_7e8;
  ulong local_7e0;
  long lStack_7d8;
  ulong *local_7d0;
  long local_7c8;
  ulong local_7c0;
  long lStack_7b8;
  ulong *local_7b0;
  long local_7a8;
  ulong local_7a0 [2];
  ulong *local_790;
  long local_788;
  ulong local_780 [2];
  ulong *local_770;
  long local_768;
  ulong local_760 [2];
  ulong *local_750;
  long local_748;
  ulong local_740 [2];
  ulong *local_730;
  long local_728;
  ulong local_720 [2];
  ulong *local_710;
  long local_708;
  ulong local_700 [2];
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 *local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 *local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 *local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  ulong *local_4b0;
  uint local_4a8;
  undefined4 uStack_4a4;
  ulong local_4a0 [2];
  ulong *local_490;
  long local_488;
  ulong local_480 [2];
  ulong *local_470;
  long local_468;
  ulong local_460 [2];
  ulong *local_450;
  long local_448;
  ulong local_440;
  long lStack_438;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0 [2];
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0 [2];
  string local_3b0;
  string local_390;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  local_9f8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)depth * '\x03' + '\f');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  local_370 = &local_360;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_360 = *plVar7;
    lStack_358 = plVar5[3];
  }
  else {
    local_360 = *plVar7;
    local_370 = (long *)*plVar5;
  }
  local_368 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_370,(ulong)(rel_name->_M_dataplus)._M_p);
  local_350 = &local_340;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_340 = *plVar7;
    lStack_338 = plVar5[3];
  }
  else {
    local_340 = *plVar7;
    local_350 = (long *)*plVar5;
  }
  local_348 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_350);
  cVar13 = (char)depth * '\x03';
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_980 = *puVar8;
    lStack_978 = plVar5[3];
    local_990 = &local_980;
  }
  else {
    local_980 = *puVar8;
    local_990 = (ulong *)*plVar5;
  }
  local_988 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar11 = cVar13 + '\x0f';
  local_710 = local_700;
  std::__cxx11::string::_M_construct((ulong)&local_710,cVar11);
  uVar17 = 0xf;
  if (local_990 != &local_980) {
    uVar17 = local_980;
  }
  if (uVar17 < (ulong)(local_708 + local_988)) {
    uVar17 = 0xf;
    if (local_710 != local_700) {
      uVar17 = local_700[0];
    }
    if (uVar17 < (ulong)(local_708 + local_988)) goto LAB_0027c328;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_710,0,(char *)0x0,(ulong)local_990);
  }
  else {
LAB_0027c328:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_990,(ulong)local_710);
  }
  local_6f0 = &local_6e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_6e0 = *puVar1;
    uStack_6d8 = puVar6[3];
  }
  else {
    local_6e0 = *puVar1;
    local_6f0 = (undefined8 *)*puVar6;
  }
  local_6e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_6f0);
  local_330 = &local_320;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_320 = *plVar7;
    lStack_318 = plVar5[3];
  }
  else {
    local_320 = *plVar7;
    local_330 = (long *)*plVar5;
  }
  local_328 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_330,(ulong)(rel_name->_M_dataplus)._M_p);
  local_310 = &local_300;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_300 = *plVar7;
    lStack_2f8 = plVar5[3];
  }
  else {
    local_300 = *plVar7;
    local_310 = (long *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_2f0 = &local_2e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2e0 = *plVar7;
    lStack_2d8 = plVar5[3];
  }
  else {
    local_2e0 = *plVar7;
    local_2f0 = (long *)*plVar5;
  }
  local_2e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_2d0 = &local_2c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2c0 = *plVar7;
    lStack_2b8 = plVar5[3];
  }
  else {
    local_2c0 = *plVar7;
    local_2d0 = (long *)*plVar5;
  }
  local_2c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_960 = *puVar8;
    lStack_958 = plVar5[3];
    local_970 = &local_960;
  }
  else {
    local_960 = *puVar8;
    local_970 = (ulong *)*plVar5;
  }
  local_968 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0027c5e1;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0027c5e1;
      }
      if (sVar9 < 10000) goto LAB_0027c5e1;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_0027c5e1:
  local_a18 = local_a08;
  std::__cxx11::string::_M_construct((ulong)&local_a18,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a18,local_a10,depth);
  uVar17 = CONCAT44(uStack_a0c,local_a10) + local_968;
  uVar16 = 0xf;
  if (local_970 != &local_960) {
    uVar16 = local_960;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_a18 != local_a08) {
      uVar16 = local_a08[0];
    }
    if (uVar16 < uVar17) goto LAB_0027c660;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a18,0,(char *)0x0,(ulong)local_970);
  }
  else {
LAB_0027c660:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_970,(ulong)local_a18);
  }
  local_6d0 = &local_6c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_6c0 = *puVar1;
    uStack_6b8 = puVar6[3];
  }
  else {
    local_6c0 = *puVar1;
    local_6d0 = (undefined8 *)*puVar6;
  }
  local_6c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_6d0);
  local_2b0 = &local_2a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2a0 = *plVar7;
    lStack_298 = plVar5[3];
  }
  else {
    local_2a0 = *plVar7;
    local_2b0 = (long *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_290 = &local_280;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_280 = *plVar7;
    lStack_278 = plVar5[3];
  }
  else {
    local_280 = *plVar7;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270 = &local_260;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_260 = *plVar7;
    lStack_258 = plVar5[3];
  }
  else {
    local_260 = *plVar7;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)(attr_name->_M_dataplus)._M_p);
  local_250 = &local_240;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_240 = *plVar7;
    lStack_238 = plVar5[3];
  }
  else {
    local_240 = *plVar7;
    local_250 = (long *)*plVar5;
  }
  local_248 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_940 = *puVar8;
    lStack_938 = plVar5[3];
    local_950 = &local_940;
  }
  else {
    local_940 = *puVar8;
    local_950 = (ulong *)*plVar5;
  }
  local_948 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = cVar13 + '\x12';
  local_730 = local_720;
  std::__cxx11::string::_M_construct((ulong)&local_730,cVar13);
  uVar17 = 0xf;
  if (local_950 != &local_940) {
    uVar17 = local_940;
  }
  if (uVar17 < (ulong)(local_728 + local_948)) {
    uVar17 = 0xf;
    if (local_730 != local_720) {
      uVar17 = local_720[0];
    }
    if (uVar17 < (ulong)(local_728 + local_948)) goto LAB_0027c93d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_730,0,(char *)0x0,(ulong)local_950);
  }
  else {
LAB_0027c93d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_950,(ulong)local_730);
  }
  local_6b0 = &local_6a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_6a0 = *puVar1;
    uStack_698 = puVar6[3];
  }
  else {
    local_6a0 = *puVar1;
    local_6b0 = (undefined8 *)*puVar6;
  }
  local_6a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_6b0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_920 = *puVar8;
    lStack_918 = plVar5[3];
    local_930 = &local_920;
  }
  else {
    local_920 = *puVar8;
    local_930 = (ulong *)*plVar5;
  }
  local_928 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0027ca70;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0027ca70;
      }
      if (sVar9 < 10000) goto LAB_0027ca70;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_0027ca70:
  local_a38 = local_a28;
  std::__cxx11::string::_M_construct((ulong)&local_a38,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a38,local_a30,depth);
  uVar17 = CONCAT44(uStack_a2c,local_a30) + local_928;
  uVar16 = 0xf;
  if (local_930 != &local_920) {
    uVar16 = local_920;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_a38 != local_a28) {
      uVar16 = local_a28[0];
    }
    if (uVar16 < uVar17) goto LAB_0027cae6;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a38,0,(char *)0x0,(ulong)local_930);
  }
  else {
LAB_0027cae6:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_930,(ulong)local_a38);
  }
  local_690 = &local_680;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_680 = *puVar1;
    uStack_678 = puVar6[3];
  }
  else {
    local_680 = *puVar1;
    local_690 = (undefined8 *)*puVar6;
  }
  local_688 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_690);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_900 = *puVar8;
    lStack_8f8 = plVar5[3];
    local_910 = &local_900;
  }
  else {
    local_900 = *puVar8;
    local_910 = (ulong *)*plVar5;
  }
  local_908 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_750 = local_740;
  std::__cxx11::string::_M_construct((ulong)&local_750,cVar11);
  uVar17 = 0xf;
  if (local_910 != &local_900) {
    uVar17 = local_900;
  }
  if (uVar17 < (ulong)(local_748 + local_908)) {
    uVar17 = 0xf;
    if (local_750 != local_740) {
      uVar17 = local_740[0];
    }
    if (uVar17 < (ulong)(local_748 + local_908)) goto LAB_0027cc39;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_750,0,(char *)0x0,(ulong)local_910);
  }
  else {
LAB_0027cc39:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_910,(ulong)local_750);
  }
  local_670 = &local_660;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_660 = *puVar1;
    uStack_658 = puVar6[3];
  }
  else {
    local_660 = *puVar1;
    local_670 = (undefined8 *)*puVar6;
  }
  local_668 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_670);
  local_230 = &local_220;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_220 = *plVar7;
    lStack_218 = plVar5[3];
  }
  else {
    local_220 = *plVar7;
    local_230 = (long *)*plVar5;
  }
  local_228 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)(attr_name->_M_dataplus)._M_p);
  local_210 = &local_200;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_200 = *plVar7;
    lStack_1f8 = plVar5[3];
  }
  else {
    local_200 = *plVar7;
    local_210 = (long *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_1f0 = &local_1e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1e0 = *plVar7;
    lStack_1d8 = plVar5[3];
  }
  else {
    local_1e0 = *plVar7;
    local_1f0 = (long *)*plVar5;
  }
  local_1e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_1d0 = &local_1c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1c0 = *plVar7;
    lStack_1b8 = plVar5[3];
  }
  else {
    local_1c0 = *plVar7;
    local_1d0 = (long *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_8e0 = *puVar8;
    uStack_8d8 = (undefined4)plVar5[3];
    uStack_8d4 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_8f0 = &local_8e0;
  }
  else {
    local_8e0 = *puVar8;
    local_8f0 = (ulong *)*plVar5;
  }
  local_8e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pCVar14 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pCVar14,
             (pointer)((long)&(pCVar14->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_390,pCVar14,&local_70,depth,parallel);
  uVar17 = 0xf;
  if (local_8f0 != &local_8e0) {
    uVar17 = local_8e0;
  }
  if (uVar17 < local_390._M_string_length + local_8e8) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      uVar15 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_390._M_string_length + local_8e8) goto LAB_0027cf35;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_8f0);
  }
  else {
LAB_0027cf35:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_8f0,(ulong)local_390._M_dataplus._M_p);
  }
  local_650 = &local_640;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_640 = *puVar1;
    uStack_638 = puVar6[3];
  }
  else {
    local_640 = *puVar1;
    local_650 = (undefined8 *)*puVar6;
  }
  local_648 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_650);
  local_1b0 = &local_1a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1a0 = *plVar7;
    lStack_198 = plVar5[3];
  }
  else {
    local_1a0 = *plVar7;
    local_1b0 = (long *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_190 = &local_180;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_180 = *plVar7;
    lStack_178 = plVar5[3];
  }
  else {
    local_180 = *plVar7;
    local_190 = (long *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_8c0 = *puVar8;
    lStack_8b8 = plVar5[3];
    local_8d0 = &local_8c0;
  }
  else {
    local_8c0 = *puVar8;
    local_8d0 = (ulong *)*plVar5;
  }
  local_8c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_770 = local_760;
  std::__cxx11::string::_M_construct((ulong)&local_770,cVar13);
  uVar17 = 0xf;
  if (local_8d0 != &local_8c0) {
    uVar17 = local_8c0;
  }
  if (uVar17 < (ulong)(local_768 + local_8c8)) {
    uVar17 = 0xf;
    if (local_770 != local_760) {
      uVar17 = local_760[0];
    }
    if (uVar17 < (ulong)(local_768 + local_8c8)) goto LAB_0027d14d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_770,0,(char *)0x0,(ulong)local_8d0);
  }
  else {
LAB_0027d14d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8d0,(ulong)local_770);
  }
  local_630 = &local_620;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_620 = *puVar1;
    uStack_618 = puVar6[3];
  }
  else {
    local_620 = *puVar1;
    local_630 = (undefined8 *)*puVar6;
  }
  local_628 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_630);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_8a0 = *puVar8;
    lStack_898 = plVar5[3];
    local_8b0 = &local_8a0;
  }
  else {
    local_8a0 = *puVar8;
    local_8b0 = (ulong *)*plVar5;
  }
  local_8a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0027d280;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0027d280;
      }
      if (sVar9 < 10000) goto LAB_0027d280;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_0027d280:
  local_a58 = local_a48;
  std::__cxx11::string::_M_construct((ulong)&local_a58,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a58,local_a50,depth);
  uVar17 = CONCAT44(uStack_a4c,local_a50) + local_8a8;
  uVar16 = 0xf;
  if (local_8b0 != &local_8a0) {
    uVar16 = local_8a0;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_a58 != local_a48) {
      uVar16 = local_a48[0];
    }
    if (uVar16 < uVar17) goto LAB_0027d2f6;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a58,0,(char *)0x0,(ulong)local_8b0);
  }
  else {
LAB_0027d2f6:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b0,(ulong)local_a58);
  }
  local_610 = &local_600;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_600 = *puVar1;
    uStack_5f8 = puVar6[3];
  }
  else {
    local_600 = *puVar1;
    local_610 = (undefined8 *)*puVar6;
  }
  local_608 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_610);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_880 = *puVar8;
    lStack_878 = plVar5[3];
    local_890 = &local_880;
  }
  else {
    local_880 = *puVar8;
    local_890 = (ulong *)*plVar5;
  }
  local_888 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_790 = local_780;
  std::__cxx11::string::_M_construct((ulong)&local_790,cVar11);
  uVar17 = 0xf;
  if (local_890 != &local_880) {
    uVar17 = local_880;
  }
  if (uVar17 < (ulong)(local_788 + local_888)) {
    uVar17 = 0xf;
    if (local_790 != local_780) {
      uVar17 = local_780[0];
    }
    if (uVar17 < (ulong)(local_788 + local_888)) goto LAB_0027d449;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_790,0,(char *)0x0,(ulong)local_890);
  }
  else {
LAB_0027d449:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_890,(ulong)local_790);
  }
  local_5f0 = &local_5e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_5e0 = *puVar1;
    uStack_5d8 = puVar6[3];
  }
  else {
    local_5e0 = *puVar1;
    local_5f0 = (undefined8 *)*puVar6;
  }
  local_5e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_860 = *puVar8;
    lStack_858 = plVar5[3];
    local_870 = &local_860;
  }
  else {
    local_860 = *puVar8;
    local_870 = (ulong *)*plVar5;
  }
  local_868 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_7b0 = local_7a0;
  std::__cxx11::string::_M_construct((ulong)&local_7b0,cVar11);
  uVar17 = 0xf;
  if (local_870 != &local_860) {
    uVar17 = local_860;
  }
  if (uVar17 < (ulong)(local_7a8 + local_868)) {
    uVar17 = 0xf;
    if (local_7b0 != local_7a0) {
      uVar17 = local_7a0[0];
    }
    if (uVar17 < (ulong)(local_7a8 + local_868)) goto LAB_0027d59f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7b0,0,(char *)0x0,(ulong)local_870);
  }
  else {
LAB_0027d59f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_870,(ulong)local_7b0);
  }
  local_5d0 = &local_5c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_5c0 = *puVar1;
    uStack_5b8 = puVar6[3];
  }
  else {
    local_5c0 = *puVar1;
    local_5d0 = (undefined8 *)*puVar6;
  }
  local_5c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  pCVar14 = (CppGenerator *)0x2afc6d;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_840 = *puVar8;
    lStack_838 = plVar5[3];
    local_850 = &local_840;
  }
  else {
    local_840 = *puVar8;
    local_850 = (ulong *)*plVar5;
  }
  local_848 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  genFindUpperBound(&local_3b0,pCVar14,rel_name,attr_name,depth,parallel);
  uVar17 = 0xf;
  if (local_850 != &local_840) {
    uVar17 = local_840;
  }
  if (uVar17 < local_3b0._M_string_length + local_848) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar15 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_3b0._M_string_length + local_848) goto LAB_0027d6eb;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_850);
  }
  else {
LAB_0027d6eb:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_850,(ulong)local_3b0._M_dataplus._M_p);
  }
  local_a78 = &local_a68;
  puVar8 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar8) {
    local_a68 = *puVar8;
    uStack_a60 = puVar6[3];
  }
  else {
    local_a68 = *puVar8;
    local_a78 = (ulong *)*puVar6;
  }
  local_a70 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  local_470 = local_460;
  std::__cxx11::string::_M_construct((ulong)&local_470,cVar13);
  uVar17 = 0xf;
  if (local_a78 != &local_a68) {
    uVar17 = local_a68;
  }
  if (uVar17 < (ulong)(local_468 + local_a70)) {
    uVar17 = 0xf;
    if (local_470 != local_460) {
      uVar17 = local_460[0];
    }
    if (uVar17 < (ulong)(local_468 + local_a70)) goto LAB_0027d7bf;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,(ulong)local_a78);
  }
  else {
LAB_0027d7bf:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a78,(ulong)local_470);
  }
  local_5b0 = &local_5a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_5a0 = *puVar1;
    uStack_598 = puVar6[3];
  }
  else {
    local_5a0 = *puVar1;
    local_5b0 = (undefined8 *)*puVar6;
  }
  local_5a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5b0);
  local_170 = &local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170 = (long *)*plVar5;
  }
  local_168 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)(attr_name->_M_dataplus)._M_p);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_130 = &local_120;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(rel_name->_M_dataplus)._M_p);
  local_110 = &local_100;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_100 = *plVar7;
    lStack_f8 = plVar5[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_e0 = *plVar7;
    lStack_d8 = plVar5[3];
  }
  else {
    local_e0 = *plVar7;
    local_f0 = (long *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_d0 = &local_c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_c0 = *plVar7;
    lStack_b8 = plVar5[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_820 = *puVar8;
    lStack_818 = plVar5[3];
    local_830 = &local_820;
  }
  else {
    local_820 = *puVar8;
    local_830 = (ulong *)*plVar5;
  }
  local_828 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0027db38;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0027db38;
      }
      if (sVar9 < 10000) goto LAB_0027db38;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_0027db38:
  local_9b0 = local_9a0;
  std::__cxx11::string::_M_construct((ulong)&local_9b0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_9b0,local_9a8,depth);
  uVar17 = CONCAT44(uStack_9a4,local_9a8) + local_828;
  uVar16 = 0xf;
  if (local_830 != &local_820) {
    uVar16 = local_820;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_9b0 != local_9a0) {
      uVar16 = local_9a0[0];
    }
    if (uVar16 < uVar17) goto LAB_0027dbbe;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9b0,0,(char *)0x0,(ulong)local_830);
  }
  else {
LAB_0027dbbe:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_830,(ulong)local_9b0);
  }
  local_590 = &local_580;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_580 = *puVar1;
    uStack_578 = puVar6[3];
  }
  else {
    local_580 = *puVar1;
    local_590 = (undefined8 *)*puVar6;
  }
  local_588 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_590);
  local_b0 = &local_a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_90 = &local_80;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_800 = *puVar8;
    lStack_7f8 = plVar5[3];
    local_810 = &local_800;
  }
  else {
    local_800 = *puVar8;
    local_810 = (ulong *)*plVar5;
  }
  local_808 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_490 = local_480;
  std::__cxx11::string::_M_construct((ulong)&local_490,cVar13);
  uVar17 = 0xf;
  if (local_810 != &local_800) {
    uVar17 = local_800;
  }
  if (uVar17 < (ulong)(local_488 + local_808)) {
    uVar17 = 0xf;
    if (local_490 != local_480) {
      uVar17 = local_480[0];
    }
    if (uVar17 < (ulong)(local_488 + local_808)) goto LAB_0027ddce;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_490,0,(char *)0x0,(ulong)local_810);
  }
  else {
LAB_0027ddce:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_810,(ulong)local_490);
  }
  local_570 = &local_560;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_560 = *puVar1;
    uStack_558 = puVar6[3];
  }
  else {
    local_560 = *puVar1;
    local_570 = (undefined8 *)*puVar6;
  }
  local_568 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_570);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7e0 = *puVar8;
    lStack_7d8 = plVar5[3];
    local_7f0 = &local_7e0;
  }
  else {
    local_7e0 = *puVar8;
    local_7f0 = (ulong *)*plVar5;
  }
  local_7e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0027df00;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0027df00;
      }
      if (sVar9 < 10000) goto LAB_0027df00;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_0027df00:
  local_9d0 = local_9c0;
  std::__cxx11::string::_M_construct((ulong)&local_9d0,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_9d0,local_9c8,depth);
  uVar17 = CONCAT44(uStack_9c4,local_9c8) + local_7e8;
  uVar16 = 0xf;
  if (local_7f0 != &local_7e0) {
    uVar16 = local_7e0;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_9d0 != local_9c0) {
      uVar16 = local_9c0[0];
    }
    if (uVar16 < uVar17) goto LAB_0027df86;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9d0,0,(char *)0x0,(ulong)local_7f0);
  }
  else {
LAB_0027df86:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_9d0);
  }
  local_550 = &local_540;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_540 = *puVar1;
    uStack_538 = puVar6[3];
  }
  else {
    local_540 = *puVar1;
    local_550 = (undefined8 *)*puVar6;
  }
  local_548 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_550);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7c0 = *puVar8;
    lStack_7b8 = plVar5[3];
    local_7d0 = &local_7c0;
  }
  else {
    local_7c0 = *puVar8;
    local_7d0 = (ulong *)*plVar5;
  }
  local_7c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0027e0b8;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0027e0b8;
      }
      if (sVar9 < 10000) goto LAB_0027e0b8;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_0027e0b8:
  local_9f0 = local_9e0;
  std::__cxx11::string::_M_construct((ulong)&local_9f0,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_9f0,local_9e8,depth);
  uVar17 = CONCAT44(uStack_9e4,local_9e8) + local_7c8;
  uVar16 = 0xf;
  if (local_7d0 != &local_7c0) {
    uVar16 = local_7c0;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_9f0 != local_9e0) {
      uVar16 = local_9e0[0];
    }
    if (uVar16 < uVar17) goto LAB_0027e13e;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9f0,0,(char *)0x0,(ulong)local_7d0);
  }
  else {
LAB_0027e13e:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d0,(ulong)local_9f0);
  }
  local_530 = &local_520;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_520 = *puVar1;
    uStack_518 = puVar6[3];
  }
  else {
    local_520 = *puVar1;
    local_530 = (undefined8 *)*puVar6;
  }
  local_528 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_530);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_440 = *puVar8;
    lStack_438 = plVar5[3];
    local_450 = &local_440;
  }
  else {
    local_440 = *puVar8;
    local_450 = (ulong *)*plVar5;
  }
  local_448 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0027e273;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0027e273;
      }
      if (sVar9 < 10000) goto LAB_0027e273;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_0027e273:
  local_4b0 = local_4a0;
  std::__cxx11::string::_M_construct((ulong)&local_4b0,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_4b0,local_4a8,depth);
  uVar17 = CONCAT44(uStack_4a4,local_4a8) + local_448;
  uVar16 = 0xf;
  if (local_450 != &local_440) {
    uVar16 = local_440;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_4b0 != local_4a0) {
      uVar16 = local_4a0[0];
    }
    if (uVar16 < uVar17) goto LAB_0027e2f9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4b0,0,(char *)0x0,(ulong)local_450);
  }
  else {
LAB_0027e2f9:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_4b0);
  }
  local_510 = &local_500;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_500 = *puVar1;
    uStack_4f8 = puVar6[3];
  }
  else {
    local_500 = *puVar1;
    local_510 = (undefined8 *)*puVar6;
  }
  local_508 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_510);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_420 = *puVar8;
    lStack_418 = plVar5[3];
    local_430 = &local_420;
  }
  else {
    local_420 = *puVar8;
    local_430 = (ulong *)*plVar5;
  }
  local_428 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct((ulong)&local_3d0,cVar11);
  uVar17 = 0xf;
  if (local_430 != &local_420) {
    uVar17 = local_420;
  }
  if (uVar17 < (ulong)(local_3c8 + local_428)) {
    uVar17 = 0xf;
    if (local_3d0 != local_3c0) {
      uVar17 = local_3c0[0];
    }
    if (uVar17 < (ulong)(local_3c8 + local_428)) goto LAB_0027e448;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_430);
  }
  else {
LAB_0027e448:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_3d0);
  }
  local_4f0 = &local_4e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4e0 = *puVar1;
    uStack_4d8 = puVar6[3];
  }
  else {
    local_4e0 = *puVar1;
    local_4f0 = (undefined8 *)*puVar6;
  }
  local_4e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_400 = *puVar8;
    lStack_3f8 = plVar5[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar8;
    local_410 = (ulong *)*plVar5;
  }
  local_408 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3f0 = local_3e0;
  std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar11);
  uVar17 = 0xf;
  if (local_410 != &local_400) {
    uVar17 = local_400;
  }
  if (uVar17 < (ulong)(local_3e8 + local_408)) {
    uVar17 = 0xf;
    if (local_3f0 != local_3e0) {
      uVar17 = local_3e0[0];
    }
    if ((ulong)(local_3e8 + local_408) <= uVar17) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,(ulong)local_410);
      goto LAB_0027e5b9;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_3f0);
LAB_0027e5b9:
  local_4d0 = &local_4c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4c0 = *puVar1;
    uStack_4b8 = puVar6[3];
  }
  else {
    local_4c0 = *puVar1;
    local_4d0 = (undefined8 *)*puVar6;
  }
  local_4c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  (local_9f8->_M_dataplus)._M_p = (pointer)&local_9f8->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (local_9f8->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_9f8->field_2 + 8) = lVar3;
  }
  else {
    (local_9f8->_M_dataplus)._M_p = (pointer)*plVar5;
    (local_9f8->field_2)._M_allocated_capacity = *psVar10;
  }
  local_9f8->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510);
  }
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530);
  }
  if (local_9f0 != local_9e0) {
    operator_delete(local_9f0);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550);
  }
  if (local_9d0 != local_9c0) {
    operator_delete(local_9d0);
  }
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_570 != &local_560) {
    operator_delete(local_570);
  }
  if (local_490 != local_480) {
    operator_delete(local_490);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_590 != &local_580) {
    operator_delete(local_590);
  }
  if (local_9b0 != local_9a0) {
    operator_delete(local_9b0);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0);
  }
  if (local_470 != local_460) {
    operator_delete(local_470);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (local_850 != &local_840) {
    operator_delete(local_850);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0);
  }
  if (local_7b0 != local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_790 != local_780) {
    operator_delete(local_790);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890);
  }
  if (local_610 != &local_600) {
    operator_delete(local_610);
  }
  if (local_a58 != local_a48) {
    operator_delete(local_a58);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_630 != &local_620) {
    operator_delete(local_630);
  }
  if (local_770 != local_760) {
    operator_delete(local_770);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_650 != &local_640) {
    operator_delete(local_650);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670);
  }
  if (local_750 != local_740) {
    operator_delete(local_750);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910);
  }
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  if (local_a38 != local_a28) {
    operator_delete(local_a38);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930);
  }
  if (local_6b0 != &local_6a0) {
    operator_delete(local_6b0);
  }
  if (local_730 != local_720) {
    operator_delete(local_730);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_6d0 != &local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_a18 != local_a08) {
    operator_delete(local_a18);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0);
  }
  if (local_710 != local_700) {
    operator_delete(local_710);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return local_9f8;
}

Assistant:

std::string CppGenerator::seekValueCase(size_t depth, const std::string& rel_name,
                                        const std::string& attr_name,
                                        bool parallel)
{
    return offset(4+depth)+"case "+rel_name+"_ID:\n"+
        //if
        offset(5+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(6+depth)+"found["+std::to_string(depth)+"] = true;\n"+
        // else if 
        offset(5+depth)+"else if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(6+depth)+"atEnd["+std::to_string(depth)+"] = true;\n"+
        //else 
        offset(5+depth)+"else\n"+offset(5+depth)+"{\n"+
        /* Calling genFindUpperBound Function */
        genFindUpperBound(rel_name,attr_name,depth, parallel)+
        // offset(6+depth)+"findUpperBound("+rel_name+",&"+rel_name+"_tuple::"+
        // attr_name+", max_"+attr_name+",lowerptr_"+rel_name+"["+
        // std::to_string(depth)+"],"+getUpperPointer(rel_name,depth,parallel)+");\n"+
        offset(6+depth)+"max_"+attr_name+" = "+rel_name+"[lowerptr_"+
        rel_name+"["+std::to_string(depth)+"]]."+attr_name+";\n"+
        offset(6+depth)+"rel["+std::to_string(depth)+"] = (rel["+
        std::to_string(depth)+"]+1) % numOfRel["+std::to_string(depth)+"];\n"+
        offset(5+depth)+"}\n"+
        //break
        offset(5+depth)+"break;\n";
}